

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.c++
# Opt level: O1

void __thiscall capnp::anon_unknown_79::Input::advance(Input *this,size_t numBytes)

{
  ulong uVar1;
  Fault f;
  Fault local_10;
  
  uVar1 = (this->wrapped).size_;
  if (numBytes <= uVar1) {
    (this->wrapped).ptr = (this->wrapped).ptr + numBytes;
    (this->wrapped).size_ = uVar1 - numBytes;
    return;
  }
  kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[31]>
            (&local_10,
             "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/compat/json.c++"
             ,0x21f,FAILED,"numBytes <= wrapped.size()","\"JSON message ends prematurely.\"",
             (char (*) [31])"JSON message ends prematurely.");
  kj::_::Debug::Fault::fatal(&local_10);
}

Assistant:

void encode(const JsonCodec& codec, DynamicStruct::Reader input,
              JsonValue::Builder output) const override {
#if _MSC_VER
    // TODO(msvc): Hack to work around missing AnyStruct::Builder constructor on MSVC.
    rawCopy(input, toDynamic(output));
#else
    rawCopy(input, kj::mv(output));
#endif
  }